

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O2

void xmrig::OclPlatform::print(void)

{
  OclPlatform *platform;
  pointer pOVar1;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  String local_58;
  _Vector_base<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> local_48;
  
  get();
  printf("%-28s%zu\n\n","Number of platforms:",
         (long)local_48._M_impl.super__Vector_impl_data._M_finish -
         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 4);
  for (pOVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
      pOVar1 != local_48._M_impl.super__Vector_impl_data._M_finish; pOVar1 = pOVar1 + 1) {
    printf("  %-26s%zu\n","Index:",pOVar1->m_index);
    profile((OclPlatform *)&local_58);
    printf("  %-26s%s\n","Profile:",local_58.m_data);
    String::~String(&local_58);
    version((OclPlatform *)&local_58);
    printf("  %-26s%s\n","Version:",local_58.m_data);
    String::~String(&local_58);
    name((OclPlatform *)&local_58);
    printf("  %-26s%s\n","Name:",local_58.m_data);
    String::~String(&local_58);
    vendor((OclPlatform *)&local_58);
    printf("  %-26s%s\n","Vendor:",local_58.m_data);
    String::~String(&local_58);
    extensions((OclPlatform *)&local_58);
    printf("  %-26s%s\n\n","Extensions:",local_58.m_data);
    String::~String(&local_58);
  }
  std::_Vector_base<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void xmrig::OclPlatform::print()
{
    const auto platforms = OclPlatform::get();

    printf("%-28s%zu\n\n", "Number of platforms:", platforms.size());

    for (const auto &platform : platforms) {
        printf("  %-26s%zu\n",  "Index:",       platform.index());
        printf("  %-26s%s\n",   "Profile:",     platform.profile().data());
        printf("  %-26s%s\n",   "Version:",     platform.version().data());
        printf("  %-26s%s\n",   "Name:",        platform.name().data());
        printf("  %-26s%s\n",   "Vendor:",      platform.vendor().data());
        printf("  %-26s%s\n\n", "Extensions:",  platform.extensions().data());
    }
}